

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void ImGuiListClipper_SeekCursorForItem(ImGuiListClipper *clipper,int item_n)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGuiWindow *pIVar5;
  ImGuiOldColumns *pIVar6;
  ImGuiTable *table;
  ImGuiContext *pIVar7;
  uint uVar8;
  float fVar9;
  float fVar10;
  
  pIVar7 = GImGui;
  fVar1 = clipper->ItemsHeight;
  fVar4 = fVar1 * (float)(item_n - *(int *)((long)clipper->TempData + 0x10)) +
          *(float *)((long)clipper->TempData + 8) + clipper->StartPosY;
  pIVar5 = GImGui->CurrentWindow;
  fVar10 = fVar4 - (pIVar5->DC).CursorPos.y;
  (pIVar5->DC).CursorPos.y = fVar4;
  fVar2 = (pIVar5->DC).CursorMaxPos.y;
  fVar3 = (pIVar7->Style).ItemSpacing.y;
  fVar9 = fVar4 - fVar3;
  uVar8 = -(uint)(fVar9 <= fVar2);
  (pIVar5->DC).CursorMaxPos.y = (float)(uVar8 & (uint)fVar2 | ~uVar8 & (uint)fVar9);
  (pIVar5->DC).CursorPosPrevLine.y = fVar4 - fVar1;
  (pIVar5->DC).PrevLineSize.y = fVar1 - fVar3;
  pIVar6 = (pIVar5->DC).CurrentColumns;
  if (pIVar6 != (ImGuiOldColumns *)0x0) {
    pIVar6->LineMinY = fVar4;
  }
  table = pIVar7->CurrentTable;
  if (table != (ImGuiTable *)0x0) {
    if (table->IsInsideRow == true) {
      ImGui::TableEndRow(table);
      fVar4 = (pIVar5->DC).CursorPos.y;
    }
    table->RowPosY2 = fVar4;
    table->RowBgColorCounter = table->RowBgColorCounter + (int)(fVar10 / fVar1 + 0.5);
  }
  return;
}

Assistant:

static void ImGuiListClipper_SeekCursorForItem(ImGuiListClipper* clipper, int item_n)
{
    // StartPosY starts from ItemsFrozen hence the subtraction
    // Perform the add and multiply with double to allow seeking through larger ranges
    ImGuiListClipperData* data = (ImGuiListClipperData*)clipper->TempData;
    float pos_y = (float)((double)clipper->StartPosY + data->LossynessOffset + (double)(item_n - data->ItemsFrozen) * clipper->ItemsHeight);
    ImGuiListClipper_SeekCursorAndSetupPrevLine(pos_y, clipper->ItemsHeight);
}